

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyRaw(CordRepBtree *this,size_t new_length)

{
  CordRepBtree *this_00;
  uint8_t *__src;
  ptrdiff_t offset;
  uint8_t *src;
  uint8_t *dst;
  CordRepBtree *tree;
  size_t new_length_local;
  CordRepBtree *this_local;
  
  this_00 = (CordRepBtree *)operator_new(0x40);
  CordRepBtree(this_00);
  (this_00->super_CordRep).length = new_length;
  __src = &(this->super_CordRep).tag;
  memcpy(&(this_00->super_CordRep).tag,__src,0x40 - ((long)__src - (long)this));
  return this_00;
}

Assistant:

inline CordRepBtree* CordRepBtree::CopyRaw(size_t new_length) const {
  CordRepBtree* tree = new CordRepBtree;

  // `length` and `refcount` are the first members of `CordRepBtree`.
  // We initialize `length` using the given length, have `refcount` be set to
  // ref = 1 through its default constructor, and copy all data beyond
  // 'refcount' which starts with `tag` using a single memcpy: all contents
  // except `refcount` is trivially copyable, and the compiler does not
  // efficiently coalesce member-wise copy of these members.
  // See https://gcc.godbolt.org/z/qY8zsca6z
  // LINT.IfChange(copy_raw)
  tree->length = new_length;
  uint8_t* dst = &tree->tag;
  const uint8_t* src = &tag;
  const ptrdiff_t offset = src - reinterpret_cast<const uint8_t*>(this);
  memcpy(dst, src, sizeof(CordRepBtree) - static_cast<size_t>(offset));
  return tree;
  // LINT.ThenChange()
}